

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

bool ON_Locale::PeriodIsCRuntimeDecimalPoint(void)

{
  bool bVar1;
  
  bVar1 = ON_CRT_LOCALE::Validate_sprintf_l();
  if (bVar1) {
    bVar1 = ON_CRT_LOCALE::Validate_sprintf_s_l();
    if (bVar1) {
      bVar1 = ON_CRT_LOCALE::Validate_sprintf();
      if (bVar1) {
        bVar1 = ON_CRT_LOCALE::Validate_sprintf_s();
        if (bVar1) {
          bVar1 = ON_CRT_LOCALE::Validate_sscanf_l();
          if (bVar1) {
            bVar1 = ON_CRT_LOCALE::Validate_sscanf_s_l();
            if (bVar1) {
              bVar1 = ON_CRT_LOCALE::Validate_sscanf();
              if (bVar1) {
                bVar1 = ON_CRT_LOCALE::Validate_sscanf_s();
                return bVar1;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Locale::PeriodIsCRuntimeDecimalPoint()
{
  // Test formatted printing

  // These tests use the locale ON_Locale::InvariantCulture.LocalePtr()
  // and should always pass.
  if (!ON_CRT_LOCALE::Validate_sprintf_l())
    return false;

  if (!ON_CRT_LOCALE::Validate_sprintf_s_l())
    return false;

  // These tests use the C-runtime locale and will fail if
  // the locale does not use a period as the decimal separator.
  if (!ON_CRT_LOCALE::Validate_sprintf())
    return false;

  if (!ON_CRT_LOCALE::Validate_sprintf_s())
    return false;

  // Test formatted scanning

  // These tests use the locale ON_Locale::InvariantCulture.LocalePtr()
  // and should always pass.
  if (!ON_CRT_LOCALE::Validate_sscanf_l())
    return false;

  if (!ON_CRT_LOCALE::Validate_sscanf_s_l())
    return false;

  // These tests use the C-runtime locale and will fail if
  // the locale does not use a period as the decimal separator.
  if (!ON_CRT_LOCALE::Validate_sscanf())
    return false;

  if (!ON_CRT_LOCALE::Validate_sscanf_s())
    return false;

  return true;

}